

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::CoherentBlendTestCaseGroup::CoherentBlendTest::iterate(CoherentBlendTest *this)

{
  undefined8 *puVar1;
  pointer log;
  RenderContext *renderCtx;
  BlendStep *pBVar2;
  glUniform4fFunc p_Var3;
  PixelFormat *this_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  GLenum GVar8;
  GLint GVar9;
  RGBA a;
  RGBA RVar10;
  RGBA RVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar12;
  ulong uVar13;
  deUint32 *pdVar14;
  TestError *this_01;
  GLSLVersion glslVersion;
  char *extensionDirective;
  long lVar15;
  int j;
  long lVar16;
  allocator<char> local_38a;
  allocator<char> local_389;
  Vec4 local_388;
  undefined8 local_378;
  undefined8 uStack_370;
  string local_368;
  pointer local_340;
  PixelFormat *local_338;
  ulong local_330;
  Vec4 refCol;
  string frgSrc;
  FBOSentry fbo;
  VertexArrayBinding posBinding;
  undefined1 local_280 [8];
  IndexType local_278;
  undefined1 *local_270;
  ShaderProgram p;
  Functions *gl;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var_00,iVar7);
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar4 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar4) {
    bVar4 = IsExtensionSupported
                      ((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced_coherent");
    local_388.m_data[0] = 0.0;
    local_388.m_data[1] = 0.0;
    local_388.m_data[2] = 0.0;
    local_388.m_data[3] = 0.0;
    extensionDirective = (char *)0x8058;
    FBOSentry::FBOSentry(&fbo,gl,0x400,0x400,0x8058);
    pcVar12 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&frgSrc,(glcts *)"blend_support_all_equations",pcVar12,
               "#extension GL_KHR_blend_equation_advanced : require",extensionDirective);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_(&local_368,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&posBinding,local_368._M_dataplus._M_p,&local_389);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&refCol,frgSrc._M_dataplus._M_p,&local_38a);
    glu::makeVtxFragSources((ProgramSources *)local_280,(string *)&posBinding,(string *)&refCol);
    glu::ShaderProgram::ShaderProgram(&p,renderCtx,(ProgramSources *)local_280);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
    std::__cxx11::string::~string((string *)&refCol);
    std::__cxx11::string::~string((string *)&posBinding);
    std::__cxx11::string::~string((string *)&local_368);
    if (p.m_program.m_info.linkOk == false) {
      glu::operator<<((TestLog *)log,&p);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x2a7);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*gl->useProgram)(p.m_program.m_program);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x2aa);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"aPos",(allocator<char> *)&local_368);
    glu::va::Float(&posBinding,(string *)local_280,2,4,0,(float *)s_pos);
    local_340 = log;
    std::__cxx11::string::~string((string *)local_280);
    (*gl->disable)(0xbd0);
    (*gl->enable)(0xbe2);
    (*gl->clearColor)(local_388.m_data[0],local_388.m_data[1],local_388.m_data[2],
                      local_388.m_data[3]);
    (*gl->clear)(0x4000);
    if (!bVar4) {
      (*gl->blendBarrier)();
    }
    local_338 = (PixelFormat *)(CONCAT44(extraout_var,iVar6) + 8);
    uVar13 = 0;
    while ((int)uVar13 < this->m_repeatCount) {
      lVar15 = 0;
      local_330 = uVar13;
      for (lVar16 = 0; lVar16 < this->m_numSteps; lVar16 = lVar16 + 1) {
        pBVar2 = this->m_steps;
        puVar1 = (undefined8 *)((long)pBVar2->src + lVar15);
        local_378 = (char *)*puVar1;
        uStack_370 = puVar1[1];
        local_368._M_dataplus._M_p = local_378;
        local_368._M_string_length = uStack_370;
        Blend((glcts *)&refCol,*(GLenum *)((long)pBVar2->src + lVar15 + -4),(Vec4 *)&local_368,
              &local_388);
        local_388.m_data[0] = refCol.m_data[0];
        local_388.m_data[1] = refCol.m_data[1];
        local_388.m_data[2] = refCol.m_data[2];
        local_388.m_data[3] = refCol.m_data[3];
        (*gl->blendEquation)(*(GLenum *)((long)pBVar2->src + lVar15 + -4));
        GVar8 = (*gl->getError)();
        glu::checkError(GVar8,"BlendEquation failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x2c6);
        p_Var3 = gl->uniform4f;
        GVar9 = (*gl->getUniformLocation)(p.m_program.m_program,"uSrcCol");
        (*p_Var3)(GVar9,(GLfloat)local_378._0_4_,local_378._4_4_,(GLfloat)uStack_370,
                  uStack_370._4_4_);
        GVar8 = (*gl->getError)();
        glu::checkError(GVar8,"Uniforms failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x2ca);
        local_280 = (undefined1  [8])0x600000000;
        local_278 = INDEXTYPE_UINT16;
        local_270 = s_indices;
        glu::draw(((this->super_TestCase).m_context)->m_renderCtx,p.m_program.m_program,1,
                  &posBinding,(PrimitiveList *)local_280,(DrawUtilCallback *)0x0);
        GVar8 = (*gl->getError)();
        glu::checkError(GVar8,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x2cf);
        if (!bVar4) {
          (*gl->blendBarrier)();
        }
        lVar15 = lVar15 + 0x14;
      }
      uVar13 = (ulong)((int)local_330 + 1);
    }
    pdVar14 = (deUint32 *)operator_new__(0x400000);
    (*gl->readPixels)(0,0,0x400,0x400,0x1908,0x1401,pdVar14);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x2d9);
    RVar11.m_value = *pdVar14;
    tcu::RGBA::RGBA((RGBA *)local_280,&local_388);
    this_00 = local_338;
    a = tcu::PixelFormat::convertColor(local_338,(RGBA *)local_280);
    RVar10 = tcu::PixelFormat::getColorThreshold(this_00);
    local_280._0_4_ = RVar10.m_value;
    RVar10 = tcu::PixelFormat::getColorThreshold(this_00);
    local_368._M_dataplus._M_p._0_4_ = RVar10.m_value;
    RVar10 = tcu::operator+((RGBA *)local_280,(RGBA *)&local_368);
    bVar5 = tcu::compareThreshold(a,RVar11,RVar10);
    bVar4 = true;
    for (lVar15 = 0; lVar15 != 0x3ff000; lVar15 = lVar15 + 4) {
      if (bVar4) {
        bVar4 = *pdVar14 == *(deUint32 *)((long)pdVar14 + lVar15);
      }
      else {
        bVar4 = false;
      }
    }
    if ((bVar5 & bVar4) == 0) {
      local_378 = (char *)CONCAT44(local_378._4_4_,RVar11.m_value);
      local_280 = (undefined1  [8])local_340;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
      std::operator<<((ostream *)&local_278,"Exceeds: ");
      tcu::operator<<((ostream *)&local_278,RVar10);
      std::operator<<((ostream *)&local_278," diff:");
      RVar11 = tcu::computeAbsDiff(a,local_378._0_4_);
      tcu::operator<<((ostream *)&local_278,RVar11);
      std::operator<<((ostream *)&local_278,"  res:");
      tcu::operator<<((ostream *)&local_278,local_378._0_4_);
      std::operator<<((ostream *)&local_278,"  ref:");
      tcu::RGBA::RGBA((RGBA *)&local_368,&local_388);
      tcu::operator<<((ostream *)&local_278,local_368._M_dataplus._M_p._0_4_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
      pcVar12 = "Fail (results differ)";
    }
    else {
      pcVar12 = "Pass";
    }
    operator_delete__(pdVar14);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)(bVar5 & bVar4 ^ 1),pcVar12);
    std::__cxx11::string::~string((string *)&posBinding.binding.name);
    glu::ShaderProgram::~ShaderProgram(&p);
    std::__cxx11::string::~string((string *)&frgSrc);
    FBOSentry::~FBOSentry(&fbo);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

CoherentBlendTestCaseGroup::CoherentBlendTest::IterateResult CoherentBlendTestCaseGroup::CoherentBlendTest::iterate(
	void)
{
	static const int		 dim = 1024;
	const tcu::RenderTarget& rt  = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf  = rt.getPixelFormat();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	TestLog&				 log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	bool needBarrier = !IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced_coherent");

	tcu::Vec4 dstCol(0.f, 0.f, 0.f, 0.f);

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);

	// Setup progra
	std::string frgSrc = GetSolidShader("blend_support_all_equations", glu::getGLSLVersionDeclaration(m_glslVersion));
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);

	// Enable blending.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);

	// Clear.
	gl.clearColor(dstCol[0], dstCol[1], dstCol[2], dstCol[3]);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Blend barrier.
	if (needBarrier)
		gl.blendBarrier();

	// Repeat block.
	for (int i = 0; i < m_repeatCount; i++)
		// Loop blending steps.
		for (int j = 0; j < m_numSteps; j++)
		{
			const BlendStep& s = m_steps[j];
			tcu::Vec4		 srcCol(s.src[0], s.src[1], s.src[2], s.src[3]);
			tcu::Vec4		 refCol = Blend(s.mode, srcCol, dstCol);
			dstCol					= refCol;

			// Set blend equation.
			gl.blendEquation(s.mode);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

			// Set source color.
			gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol[0], srcCol[1], srcCol[2], srcCol[3]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

			// Draw.
			glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

			// Blend barrier.
			if (needBarrier)
				gl.blendBarrier();
		}

	// Read the results.
	glw::GLubyte* result = new glw::GLubyte[4 * dim * dim];
	gl.readPixels(0, 0, dim, dim, GL_RGBA, GL_UNSIGNED_BYTE, result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	// Check that first pixel is ok.
	tcu::RGBA res		= tcu::RGBA::fromBytes(result);
	tcu::RGBA ref		= pf.convertColor(tcu::RGBA(dstCol));
	tcu::RGBA threshold = pf.getColorThreshold() + pf.getColorThreshold();
	bool	  firstOk   = tcu::compareThreshold(ref, res, threshold);

	// Check that all pixels are the same as the first one.
	bool allSame = true;
	for (int i = 0; i < dim * (dim - 1); i++)
		allSame = allSame && (0 == memcmp(result, result + (i * 4), 4));

	bool pass = firstOk && allSame;
	if (!pass)
	{
		log << TestLog::Message << "Exceeds: " << threshold << " diff:" << tcu::computeAbsDiff(ref, res)
			<< "  res:" << res << "  ref:" << tcu::RGBA(dstCol) << TestLog::EndMessage;
	}

	delete[] result;

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail (results differ)");
	return STOP;
}